

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O3

Edits * __thiscall icu_63::Edits::moveArray(Edits *this,Edits *src)

{
  uint uVar1;
  
  if (this->errorCode_ < U_ILLEGAL_ARGUMENT_ERROR) {
    releaseArray(this);
    uVar1 = this->length;
    if ((int)uVar1 < 0x65) {
      this->array = this->stackArray;
      this->capacity = 100;
      if (0 < (int)uVar1) {
        memcpy(this->stackArray,src->array,(ulong)uVar1 * 2);
      }
    }
    else {
      this->array = src->array;
      this->capacity = src->capacity;
      src->array = src->stackArray;
      src->capacity = 100;
      src->length = 0;
      src->delta = 0;
      src->numChanges = 0;
      src->errorCode_ = U_ZERO_ERROR;
    }
  }
  else {
    this->numChanges = 0;
    this->length = 0;
    this->delta = 0;
  }
  return this;
}

Assistant:

Edits &Edits::moveArray(Edits &src) U_NOEXCEPT {
    if (U_FAILURE(errorCode_)) {
        length = delta = numChanges = 0;
        return *this;
    }
    releaseArray();
    if (length > STACK_CAPACITY) {
        array = src.array;
        capacity = src.capacity;
        src.array = src.stackArray;
        src.capacity = STACK_CAPACITY;
        src.reset();
        return *this;
    }
    array = stackArray;
    capacity = STACK_CAPACITY;
    if (length > 0) {
        uprv_memcpy(array, src.array, (size_t)length * 2);
    }
    return *this;
}